

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkMiterQuantify(Abc_Ntk_t *pNtk,int In,int fExist)

{
  int iVar1;
  Abc_Ntk_t *pNtkMiter;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *p0;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                  ,0x24b,"Abc_Ntk_t *Abc_NtkMiterQuantify(Abc_Ntk_t *, int, int)");
  }
  if (pNtk->vCos->nSize != 1) {
    __assert_fail("1 == Abc_NtkCoNum(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                  ,0x24c,"Abc_Ntk_t *Abc_NtkMiterQuantify(Abc_Ntk_t *, int, int)");
  }
  if (pNtk->vCis->nSize <= In) {
    __assert_fail("In < Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                  ,0x24d,"Abc_Ntk_t *Abc_NtkMiterQuantify(Abc_Ntk_t *, int, int)");
  }
  if (pNtk->nObjCounts[8] == pNtk->vBoxes->nSize) {
    pNtkMiter = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    if (0 < pNtk->vCos->nSize) {
      pcVar2 = Abc_ObjName((Abc_Obj_t *)*pNtk->vCos->pArray);
      pcVar2 = Extra_UtilStrsav(pcVar2);
      pNtkMiter->pName = pcVar2;
      if (0 < pNtk->vCos->nSize) {
        pAVar4 = (Abc_Obj_t *)*pNtk->vCos->pArray;
        Abc_NtkMiterPrepare(pNtk,pNtk,pNtkMiter,1,-1,0);
        pAVar3 = Abc_AigConst1(pNtkMiter);
        if ((-1 < In) && (In < pNtk->vCis->nSize)) {
          *(ulong *)((long)pNtk->vCis->pArray[(uint)In] + 0x40) = (ulong)pAVar3 ^ 1;
          Abc_NtkMiterAddCone(pNtk,pNtkMiter,pAVar4);
          p0 = (Abc_Obj_t *)
               ((ulong)(*(uint *)&pAVar4->field_0x14 >> 10 & 1) ^
               *(ulong *)((long)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray] + 0x40));
          pAVar3 = Abc_AigConst1(pNtkMiter);
          if (In < pNtk->vCis->nSize) {
            *(Abc_Obj_t **)((long)pNtk->vCis->pArray[(uint)In] + 0x40) = pAVar3;
            Abc_NtkMiterAddCone(pNtk,pNtkMiter,pAVar4);
            pAVar4 = (Abc_Obj_t *)
                     ((ulong)(*(uint *)&pAVar4->field_0x14 >> 10 & 1) ^
                     *(ulong *)((long)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray] + 0x40)
                     );
            if (fExist == 0) {
              pAVar4 = Abc_AigAnd((Abc_Aig_t *)pNtkMiter->pManFunc,p0,pAVar4);
            }
            else {
              pAVar4 = Abc_AigOr((Abc_Aig_t *)pNtkMiter->pManFunc,p0,pAVar4);
            }
            if (0 < pNtkMiter->vPos->nSize) {
              Abc_ObjAddFanin((Abc_Obj_t *)*pNtkMiter->vPos->pArray,pAVar4);
              iVar1 = Abc_NtkCheck(pNtkMiter);
              if (iVar1 == 0) {
                puts("Abc_NtkMiter: The network check has failed.");
                Abc_NtkDelete(pNtkMiter);
                pNtkMiter = (Abc_Ntk_t *)0x0;
              }
              return pNtkMiter;
            }
          }
        }
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                ,0x24e,"Abc_Ntk_t *Abc_NtkMiterQuantify(Abc_Ntk_t *, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterQuantify( Abc_Ntk_t * pNtk, int In, int fExist )
{
    Abc_Ntk_t * pNtkMiter;
    Abc_Obj_t * pRoot, * pOutput1, * pOutput2, * pMiter;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( 1 == Abc_NtkCoNum(pNtk) );
    assert( In < Abc_NtkCiNum(pNtk) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk) );

    // start the new network
    pNtkMiter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkMiter->pName = Extra_UtilStrsav( Abc_ObjName(Abc_NtkCo(pNtk, 0)) );

    // get the root output
    pRoot = Abc_NtkCo( pNtk, 0 );

    // perform strashing
    Abc_NtkMiterPrepare( pNtk, pNtk, pNtkMiter, 1, -1, 0 );
    // set the first cofactor
    Abc_NtkCi(pNtk, In)->pCopy = Abc_ObjNot( Abc_AigConst1(pNtkMiter) );
    // add the first cofactor
    Abc_NtkMiterAddCone( pNtk, pNtkMiter, pRoot );
    // save the output
//    pOutput1 = Abc_ObjFanin0(pRoot)->pCopy;
    pOutput1 = Abc_ObjNotCond( Abc_ObjFanin0(pRoot)->pCopy, Abc_ObjFaninC0(pRoot) );

    // set the second cofactor
    Abc_NtkCi(pNtk, In)->pCopy = Abc_AigConst1(pNtkMiter);
    // add the second cofactor
    Abc_NtkMiterAddCone( pNtk, pNtkMiter, pRoot );
    // save the output
//    pOutput2 = Abc_ObjFanin0(pRoot)->pCopy;
    pOutput2 = Abc_ObjNotCond( Abc_ObjFanin0(pRoot)->pCopy, Abc_ObjFaninC0(pRoot) );

    // create the miter of the two outputs
    if ( fExist ) 
        pMiter = Abc_AigOr( (Abc_Aig_t *)pNtkMiter->pManFunc, pOutput1, pOutput2 );
    else
        pMiter = Abc_AigAnd( (Abc_Aig_t *)pNtkMiter->pManFunc, pOutput1, pOutput2 );
    Abc_ObjAddFanin( Abc_NtkPo(pNtkMiter,0), pMiter );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkMiter ) )
    {
        printf( "Abc_NtkMiter: The network check has failed.\n" );
        Abc_NtkDelete( pNtkMiter );
        return NULL;
    }
    return pNtkMiter;
}